

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O2

void __thiscall
kratos::SystemVerilogCodeGen::generate_variables(SystemVerilogCodeGen *this,Generator *generator)

{
  int iVar1;
  pointer pbVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  IRNode *local_50;
  pointer local_40;
  SystemVerilogCodeGen *local_38;
  
  Generator::get_vars_abi_cxx11_(&local_68,generator);
  local_40 = (pointer)&this->stream_;
  local_38 = this;
  for (pbVar2 = local_68.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar2 != local_68.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar2 = pbVar2 + 1) {
    Generator::get_var((Generator *)&stack0xffffffffffffffb0,(string *)generator);
    if ((int)local_50[3].comment._M_string_length == 0) {
      iVar1 = (*local_50->_vptr_IRNode[0x1d])();
      if ((char)iVar1 == '\0') {
        if ((local_38->options_).yosys_src == true) {
          output_yosys_src(local_38,local_50);
        }
        Stream::operator<<((Stream *)local_40,(shared_ptr<kratos::Var> *)&stack0xffffffffffffffb0);
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffb8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  return;
}

Assistant:

void SystemVerilogCodeGen::generate_variables(Generator* generator) {
    auto const& vars = generator->get_vars();
    for (auto const& var_name : vars) {
        auto const& var = generator->get_var(var_name);
        if (var->type() == VarType::Base && !var->is_interface()) {
            if (options_.yosys_src) output_yosys_src(var.get());
            stream_ << var;
        }
    }
}